

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_types.cc
# Opt level: O2

bool draco::IsDataTypeIntegral(DataType dt)

{
  return (bool)((byte)(0x9fe >> ((byte)dt & 0x1f)) & dt < DT_TYPES_COUNT);
}

Assistant:

bool IsDataTypeIntegral(DataType dt) {
  switch (dt) {
    case DT_INT8:
    case DT_UINT8:
    case DT_INT16:
    case DT_UINT16:
    case DT_INT32:
    case DT_UINT32:
    case DT_INT64:
    case DT_UINT64:
    case DT_BOOL:
      return true;
    default:
      return false;
  }
}